

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void QtPromisePrivate::PromiseDispatch<QtPromise::QPromise<int>>::
     call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>,tst_qpromise_finally::rejectedAsyncResolve()::__1>
               (QPromiseResolve<int> *resolve,QPromiseReject<int> *reject,anon_class_8_1_70098e60 fn
               )

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar2;
  char cVar3;
  PromiseData<int> *pPVar4;
  QObject *pQVar5;
  int *piVar6;
  QEvent *this;
  PromiseResolver<int> resolver;
  QPromise<int> local_80;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_70 [2];
  QPromise<int> local_60;
  QPromiseReject<int> *local_50;
  int *local_48;
  QObject *local_40;
  QPromiseResolve<int> *local_38;
  
  local_80.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca58;
  local_50 = reject;
  pPVar4 = (PromiseData<int> *)operator_new(0x68);
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0012cc30;
  QReadWriteLock::QReadWriteLock(&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0)
  ;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0012cbc8;
  (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar4 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_60.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012cb90;
  local_80.super_QPromiseBase<int>.m_d.d = pPVar4;
  local_60.super_QPromiseBase<int>.m_d.d = pPVar4;
  local_38 = resolve;
  PromiseResolver<int>::PromiseResolver((PromiseResolver<int> *)local_70,&local_60);
  local_60.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca58;
  if (local_60.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_60.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_60.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_60.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  QVar2.d = local_70[0].d;
  if (local_70[0].d != (Data *)0x0) {
    LOCK();
    ((local_70[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         ((local_70[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    ((local_70[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         ((local_70[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar5 = (QObject *)QThread::currentThread();
  if (pQVar5 == (QObject *)0x0) goto LAB_0011578b;
  piVar6 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar5);
  local_48 = piVar6;
  local_40 = pQVar5;
  if (piVar6 == (int *)0x0) goto LAB_0011578b;
  if (piVar6[1] != 0) {
    cVar3 = QThread::isFinished();
    if (cVar3 == '\0') {
      if (piVar6[1] == 0) {
        pQVar5 = (QObject *)(QThread *)0x0;
      }
      pQVar5 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar5);
      if (pQVar5 == (QObject *)0x0) {
        cVar3 = QCoreApplication::closingDown();
        if (cVar3 != '\0') goto LAB_00115773;
      }
      this = (QEvent *)operator_new(0x20);
      QEvent::QEvent(this,None);
      *(undefined ***)this = &PTR__Event_0012c8f0;
      *(QVector<int> **)(this + 0x10) = fn.values;
      *(Data **)(this + 0x18) = QVar2.d;
      if (QVar2.d != (Data *)0x0) {
        LOCK();
        ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QCoreApplication::postEvent(pQVar5,this,0);
      piVar6 = local_48;
      if (local_48 == (int *)0x0) goto LAB_0011578b;
    }
  }
LAB_00115773:
  LOCK();
  *piVar6 = *piVar6 + -1;
  UNLOCK();
  if (*piVar6 == 0) {
    piVar6 = local_48;
    if (local_48 == (int *)0x0) {
      piVar6 = (int *)0x0;
    }
    operator_delete(piVar6);
  }
LAB_0011578b:
  if (QVar2.d != (Data *)0x0) {
    LOCK();
    ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar2.d,0x10);
    }
    LOCK();
    ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar2.d,0x10);
    }
  }
  if (local_70[0].d != (Data *)0x0) {
    LOCK();
    ((local_70[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         ((local_70[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_70[0].d,0x10);
    }
  }
  local_80.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012cb90;
  local_60.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(local_60.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,8);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)fn.values,((fn.values)->d).size,(int *)&local_60);
  PromiseFulfill<QtPromise::QPromise<int>>::
  call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(&local_80,local_38,local_50);
  local_80.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca58;
  if (local_80.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_80.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_80.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_80.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }